

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool __thiscall BasePort::WriteAllBoardsBroadcast(BasePort *this)

{
  uchar *puVar1;
  BoardIO *pBVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  long lVar10;
  bool bVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  ostream *poVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  quadlet_t ctrl;
  long *local_50 [2];
  long local_40 [2];
  
  iVar3 = (*this->_vptr_BasePort[0x11])();
  if ((char)iVar3 == '\0') {
    poVar16 = this->outStr;
    pcVar12 = "BasePort::WriteAllBoardsBroadcast: port not initialized";
    lVar10 = 0x37;
  }
  else {
    if (((this->IsAllBoardsRev4_6_ != false) || (this->IsAllBoardsRev7_ != false)) ||
       (this->IsAllBoardsRev8_9_ != false)) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"WriteAllBoardsBroadcast","");
      iVar3 = (*this->_vptr_BasePort[0x1b])(this,(string *)local_50,(ulong)this->autoReScan);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((char)iVar3 != '\0') {
        puVar1 = this->WriteBufferBroadcast;
        uVar4 = (*this->_vptr_BasePort[0x17])(this);
        uVar5 = (*this->_vptr_BasePort[0x14])(this,2);
        uVar7 = this->max_board;
        if (uVar7 == 0) {
          uVar14 = 0;
        }
        else {
          uVar13 = 0;
          uVar14 = 0;
          do {
            if (this->BoardList[uVar13] != (BoardIO *)0x0) {
              uVar6 = (*this->BoardList[uVar13]->_vptr_BoardIO[3])();
              uVar7 = uVar6 - 4;
              if (this->IsAllBoardsRev4_6_ == false) {
                uVar7 = uVar6;
              }
              (*this->BoardList[uVar13]->_vptr_BoardIO[4])
                        (this->BoardList[uVar13],
                         puVar1 + (ulong)uVar5 + (ulong)uVar4 +
                         ((long)(int)uVar14 & 0xfffffffffffffffc),0,uVar7 >> 2,1);
              uVar14 = (ulong)((int)uVar14 + uVar7);
              uVar7 = this->max_board;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < uVar7);
        }
        iVar3 = (*this->_vptr_BasePort[0x28])(this,puVar1 + (ulong)uVar5 + (ulong)uVar4,uVar14);
        if (this->max_board == 0) {
          bVar15 = true;
        }
        else {
          bVar15 = true;
          uVar14 = 0;
          bVar19 = true;
          do {
            pBVar2 = this->BoardList[uVar14];
            if (pBVar2 != (BoardIO *)0x0) {
              bVar11 = SUB41(iVar3,0);
              if (this->FirmwareVersion[uVar14] < 7) {
                uVar7 = (*pBVar2->_vptr_BoardIO[3])();
                (*this->BoardList[uVar14]->_vptr_BoardIO[4])
                          (this->BoardList[uVar14],local_50,(ulong)((uVar7 >> 2) - 1),1,0);
                bVar20 = (int)local_50[0] == 0;
                bVar17 = bVar15;
                if (bVar20) {
LAB_0011113d:
                  iVar8 = (*this->BoardList[uVar14]->_vptr_BoardIO[6])();
                  bVar9 = bVar20;
                  bVar18 = bVar19;
                  bVar15 = bVar17;
                  if ((char)iVar8 == '\0') {
                    iVar8 = (*this->_vptr_BasePort[0x25])(this,uVar14 & 0xff);
                    bVar18 = (bool)(((byte)iVar8 ^ 1) & bVar19);
                  }
                }
                else {
                  bVar18 = false;
                  iVar8 = (*this->_vptr_BasePort[0x24])(this,uVar14 & 0xff,0);
                  bVar9 = true;
                  bVar17 = bVar18;
                  if ((char)iVar8 == '\0') goto LAB_0011113d;
                }
                pBVar2 = this->BoardList[uVar14];
                pBVar2->writeValid = (bool)(bVar9 & bVar11);
                if ((bool)(bVar9 & bVar11) == false) {
                  pBVar2->numWriteErrors = pBVar2->numWriteErrors + 1;
                }
                (*pBVar2->_vptr_BoardIO[5])();
                bVar19 = bVar18;
              }
              else {
                pBVar2->writeValid = bVar11;
                if (bVar11 == false) {
                  pBVar2->numWriteErrors = pBVar2->numWriteErrors + 1;
                  (*pBVar2->_vptr_BoardIO[5])();
                }
                else {
                  (*pBVar2->_vptr_BoardIO[5])();
                  (*this->BoardList[uVar14]->_vptr_BoardIO[7])();
                  bVar19 = false;
                }
              }
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < this->max_board);
          if (bVar19 == false) {
            return bVar15;
          }
        }
        (*this->_vptr_BasePort[9])(this);
        return bVar15;
      }
      goto LAB_00111056;
    }
    poVar16 = this->outStr;
    pcVar12 = "BasePort::WriteAllBoardsBroadcast: invalid mix of firmware";
    lVar10 = 0x3a;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar12,lVar10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  std::ostream::put((char)poVar16);
  std::ostream::flush();
LAB_00111056:
  (*this->_vptr_BasePort[9])(this);
  return false;
}

Assistant:

bool BasePort::WriteAllBoardsBroadcast(void)
{
    if (!IsOK()) {
        outStr << "BasePort::WriteAllBoardsBroadcast: port not initialized" << std::endl;
        OnNoneWritten();
        return false;
    }

    if (!IsBroadcastFirmwareMixValid()) {
        outStr << "BasePort::WriteAllBoardsBroadcast: invalid mix of firmware" << std::endl;
        OnNoneWritten();
        return false;
    }

    if (!CheckFwBusGeneration("WriteAllBoardsBroadcast", autoReScan)) {
        OnNoneWritten();
        return false;
    }

    bool rtWrite = true;   // for debugging

    // sanity check vars
    bool allOK = true;
    bool noneWritten = true;

    // construct broadcast write buffer
    quadlet_t *bcBuffer = reinterpret_cast<quadlet_t *>(WriteBufferBroadcast + GetWriteQuadAlign() + GetPrefixOffset(WR_FW_BDATA));

    int bcBufferOffset = 0; // the offset for new data to be stored in bcBuffer (bytes)
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            unsigned int numBytes = BoardList[board]->GetWriteNumBytes();
            quadlet_t *bcPtr = bcBuffer+bcBufferOffset/sizeof(quadlet_t);
            if (IsAllBoardsRev4_6_) {
                numBytes -= sizeof(quadlet_t);   // for ctrl offset
                unsigned int numQuads = numBytes/4;
                BoardList[board]->GetWriteData(bcPtr, 0, numQuads);
            }
            else {
                unsigned int numQuads = numBytes/4;
                BoardList[board]->GetWriteData(bcPtr, 0, numQuads);
            }
            // bcBufferOffset equals total numBytes to write, when the loop ends
            bcBufferOffset = bcBufferOffset + numBytes;
        }
    }

    // now broadcast out the huge packet
    bool ret;

    ret = WriteBroadcastOutput(bcBuffer, bcBufferOffset);

    // Send out control quadlet if necessary (firmware prior to Rev 7);
    //    also check for data collection
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            if (FirmwareVersion[board] < 7) {
                bool noneWrittenThisBoard = true;
                unsigned int numBytes = BoardList[board]->GetWriteNumBytes();
                // Get last quadlet (false -> no byteswapping)
                quadlet_t ctrl;
                BoardList[board]->GetWriteData(&ctrl, (numBytes/sizeof(quadlet_t))-1, 1, false);
                bool ret2 = true;
                if (ctrl) {  // if anything non-zero, write it
                    ret2 = WriteQuadlet(board, 0x00, ctrl);
                    if (ret2) { noneWritten = false; noneWrittenThisBoard = false; }
                    else allOK = false;
                }
                if (noneWrittenThisBoard
                    && !(BoardList[board]->WriteBufferResetsWatchdog())) {
                    // send no-op to reset watchdog
                    bool ret3 = WriteNoOp(board);
                    if (ret3) noneWritten = false;
                }
                BoardList[board]->SetWriteValid(ret&&ret2);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
            }
            else {
                BoardList[board]->SetWriteValid(ret);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
                if (ret) {
                    noneWritten = false;
                    // Check for data collection callback
                    BoardList[board]->CheckCollectCallback();
                }
            }
        }
    }

    if (noneWritten) {
        OnNoneWritten();
    }
    if (!rtWrite)
        outStr << "BasePort::WriteAllBoardsBroadcast: rtWrite is false" << std::endl;

    // return
    return allOK;
}